

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O1

bool TtfUtil::GlyfPoints(gid16 nGlyphId,void *pGlyf,void *pLoca,size_t lLocaSize,void *pHead,
                        int *prgnContourEndPoint,size_t cnEndPoints,int *prgnX,int *prgnY,
                        bool *prgfOnCurve,size_t *cnPoints)

{
  ushort nGlyphId_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool *prgfOnCurve_00;
  ushort *pSimpleGlyf;
  bool bVar4;
  byte bVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  void *pSimpleGlyf_00;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  uint uVar9;
  int iVar10;
  int iVar11;
  Glyph *pGlyph;
  int *prgnY_00;
  ulong uVar12;
  long lVar13;
  void *pHead_00;
  void *pLoca_00;
  undefined1 auVar14 [16];
  int iVar15;
  undefined1 auVar16 [16];
  int iVar18;
  undefined1 auVar17 [16];
  bool fTransOff;
  size_t local_f0;
  int *local_e8;
  size_t cActualPts;
  uint local_d4;
  void *local_d0;
  size_t local_c8;
  void *local_c0;
  bool *local_b8;
  gid16 *local_b0;
  void *local_a8;
  float flt22;
  float flt21;
  float flt12;
  float flt11;
  int b;
  int a;
  ulong local_88;
  size_t cNestedPts;
  size_t cCompId;
  ulong local_70;
  ushort *local_68;
  int *local_60;
  int rgnCompId [8];
  
  auVar3 = _DAT_00204030;
  auVar2 = _DAT_00204020;
  auVar1 = _DAT_00204010;
  sVar7 = *cnPoints;
  if (sVar7 != 0) {
    uVar6 = sVar7 + 0x3fffffffffffffff & 0x3fffffffffffffff;
    uVar9 = (uint)(sVar7 + 0x3fffffffffffffff);
    auVar14._8_4_ = (int)uVar6;
    auVar14._0_8_ = uVar6;
    auVar14._12_4_ = (int)(uVar6 >> 0x20);
    lVar13 = 0;
    auVar14 = auVar14 ^ _DAT_00204030;
    do {
      auVar16._8_4_ = (int)lVar13;
      auVar16._0_8_ = lVar13;
      auVar16._12_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar17 = (auVar16 | auVar2) ^ auVar3;
      iVar10 = auVar14._0_4_;
      iVar11 = auVar14._4_4_;
      iVar15 = auVar14._12_4_;
      if ((bool)(~(auVar17._4_4_ == iVar11 && iVar10 < auVar17._0_4_ || iVar11 < auVar17._4_4_) & 1)
         ) {
        prgnX[lVar13] = 0x7fffffff;
      }
      if ((auVar17._12_4_ != iVar15 || auVar17._8_4_ <= auVar14._8_4_) && auVar17._12_4_ <= iVar15)
      {
        prgnX[lVar13 + 1] = 0x7fffffff;
      }
      auVar16 = (auVar16 | auVar1) ^ auVar3;
      iVar18 = auVar16._4_4_;
      if (iVar18 <= iVar11 && (iVar18 != iVar11 || auVar16._0_4_ <= iVar10)) {
        prgnX[lVar13 + 2] = 0x7fffffff;
        prgnX[lVar13 + 3] = 0x7fffffff;
      }
      lVar13 = lVar13 + 4;
    } while ((uVar6 - (uVar9 & 3)) + 4 != lVar13);
    if (sVar7 != 0) {
      lVar13 = 0;
      do {
        auVar17._8_4_ = (int)lVar13;
        auVar17._0_8_ = lVar13;
        auVar17._12_4_ = (int)((ulong)lVar13 >> 0x20);
        auVar16 = (auVar17 | auVar2) ^ auVar3;
        if ((bool)(~(auVar16._4_4_ == iVar11 && iVar10 < auVar16._0_4_ || iVar11 < auVar16._4_4_) &
                  1)) {
          prgnY[lVar13] = 0x7fffffff;
        }
        if ((auVar16._12_4_ != iVar15 || auVar16._8_4_ <= auVar14._8_4_) && auVar16._12_4_ <= iVar15
           ) {
          prgnY[lVar13 + 1] = 0x7fffffff;
        }
        auVar16 = (auVar17 | auVar1) ^ auVar3;
        iVar18 = auVar16._4_4_;
        if (iVar18 <= iVar11 && (iVar18 != iVar11 || auVar16._0_4_ <= iVar10)) {
          prgnY[lVar13 + 2] = 0x7fffffff;
          prgnY[lVar13 + 3] = 0x7fffffff;
        }
        lVar13 = lVar13 + 4;
      } while ((uVar6 - (uVar9 & 3)) + 4 != lVar13);
    }
  }
  local_a8 = pGlyf;
  local_60 = prgnContourEndPoint;
  sVar7 = LocaLookup(nGlyphId,pLoca,lLocaSize,pHead);
  sVar8 = LocaLookup(nGlyphId + 1,pLoca,lLocaSize,pHead);
  if (((int)sVar8 != (int)sVar7) &&
     (local_c0 = pLoca, local_68 = (ushort *)GlyfLookup(nGlyphId,local_a8,pLoca,lLocaSize,pHead),
     local_68 != (ushort *)0x0)) {
    if ((short)(*local_68 << 8 | *local_68 >> 8) < 1) {
      cCompId = 0;
      bVar4 = GetComponentGlyphIds(local_68,rgnCompId,8,&cCompId);
      if (bVar4) {
        local_c8 = *cnPoints;
        fTransOff = true;
        local_d4 = (uint)CONCAT71((int7)(local_c8 >> 8),cCompId == 0);
        if (cCompId != 0) {
          local_b0 = (gid16 *)rgnCompId;
          local_e8 = (int *)LocaLookup((ushort)rgnCompId[0],local_c0,lLocaSize,pHead);
          local_d0 = pHead;
          local_70 = (ulong)(ushort)rgnCompId[0];
          sVar7 = LocaLookup((ushort)rgnCompId[0] + 1,local_c0,lLocaSize,pHead);
          if ((int)sVar7 != (int)local_e8) {
            local_88 = 0;
            local_b8 = prgfOnCurve;
            local_e8 = prgnY;
            uVar6 = local_70;
            pHead_00 = local_d0;
            pLoca_00 = local_c0;
            local_f0 = lLocaSize;
            do {
              pSimpleGlyf_00 = GlyfLookup((gid16)uVar6,local_a8,pLoca_00,lLocaSize,pHead_00);
              prgfOnCurve_00 = local_b8;
              sVar7 = local_c8;
              prgnY_00 = local_e8;
              if (pSimpleGlyf_00 == (void *)0x0) {
                bVar4 = false;
                sVar8 = 0;
              }
              else {
                bVar4 = GlyfPoints(pSimpleGlyf_00,prgnX,local_e8,local_b8,local_c8,&cActualPts);
                if (bVar4) {
                  if (1 < cActualPts) {
                    iVar10 = *prgnY_00;
                    iVar11 = *prgnX;
                    sVar7 = 1;
                    do {
                      iVar11 = iVar11 + prgnX[sVar7];
                      prgnX[sVar7] = iVar11;
                      iVar10 = iVar10 + prgnY_00[sVar7];
                      prgnY_00[sVar7] = iVar10;
                      sVar7 = sVar7 + 1;
                    } while (cActualPts != sVar7);
                  }
                }
                else {
                  cNestedPts = sVar7;
                  bVar4 = GlyfPoints(*local_b0,local_a8,pLoca_00,local_f0,pHead_00,local_60,
                                     cnEndPoints,prgnX,prgnY_00,prgfOnCurve_00,&cNestedPts);
                  sVar8 = CONCAT71(extraout_var,bVar4);
                  if (!bVar4) {
                    bVar4 = false;
                    lLocaSize = local_f0;
                    goto LAB_001e3b80;
                  }
                  cActualPts = sVar7 - cNestedPts;
                }
                pSimpleGlyf = local_68;
                iVar10 = *(int *)local_b0;
                bVar4 = GetComponentPlacement(local_68,iVar10,false,&a,&b);
                sVar8 = CONCAT71(extraout_var_00,bVar4);
                if (bVar4) {
                  bVar4 = GetComponentTransform
                                    (pSimpleGlyf,iVar10,&flt11,&flt12,&flt21,&flt22,&fTransOff);
                  sVar8 = CONCAT71(extraout_var_01,bVar4);
                  if (bVar4) {
                    if ((((((flt11 != 1.0) || (NAN(flt11))) || (flt12 != 0.0)) ||
                         ((NAN(flt12) || (flt21 != 0.0)))) ||
                        ((NAN(flt21) || ((flt22 != 1.0 || (NAN(flt22))))))) && (cActualPts != 0)) {
                      uVar6 = 0;
                      do {
                        iVar10 = prgnX[uVar6];
                        iVar11 = prgnY_00[uVar6];
                        prgnX[uVar6] = (int)((float)iVar10 * flt11 + flt12 * (float)iVar11);
                        prgnY_00[uVar6] = (int)((float)iVar10 * flt21 + (float)iVar11 * flt22);
                        uVar6 = uVar6 + 1;
                      } while ((uVar6 & 0xffffffff) < cActualPts);
                    }
                    if (cActualPts != 0) {
                      uVar6 = 0;
                      do {
                        prgnX[uVar6] = prgnX[uVar6] + a;
                        prgnY_00[uVar6] = prgnY_00[uVar6] + b;
                        uVar6 = uVar6 + 1;
                      } while ((uVar6 & 0xffffffff) < cActualPts);
                    }
                    prgnX = prgnX + cActualPts;
                    prgnY_00 = prgnY_00 + cActualPts;
                    local_b8 = local_b8 + cActualPts;
                    local_c8 = local_c8 - cActualPts;
                    bVar4 = true;
                    sVar8 = cActualPts;
                    lLocaSize = local_f0;
                    pHead_00 = local_d0;
                    goto LAB_001e3b80;
                  }
                }
                bVar4 = false;
                lLocaSize = local_f0;
                pHead_00 = local_d0;
              }
LAB_001e3b80:
              pLoca_00 = local_c0;
              if (!bVar4) break;
              local_88 = local_88 + 1;
              local_d4 = (uint)CONCAT71((int7)(sVar8 >> 8),cCompId <= local_88);
              if (cCompId <= local_88) break;
              local_b0 = (gid16 *)(rgnCompId + local_88);
              nGlyphId_00 = *local_b0;
              uVar6 = (ulong)nGlyphId_00;
              local_e8 = prgnY_00;
              sVar7 = LocaLookup(nGlyphId_00,local_c0,lLocaSize,pHead_00);
              sVar8 = LocaLookup(nGlyphId_00 + 1,pLoca_00,lLocaSize,pHead_00);
            } while ((int)sVar8 != (int)sVar7);
          }
        }
        bVar5 = (byte)local_d4;
        if ((local_d4 & 1) != 0) {
          sVar7 = *cnPoints;
          if (sVar7 != 0) {
            sVar8 = 0;
            do {
              prgfOnCurve[sVar8] = (bool)(prgfOnCurve[sVar8] & 1);
              sVar8 = sVar8 + 1;
            } while (sVar7 != sVar8);
          }
          *cnPoints = local_c8;
        }
        goto LAB_001e38f8;
      }
    }
    else {
      bVar4 = GlyfPoints(local_68,prgnX,prgnY,prgfOnCurve,*cnPoints,&cActualPts);
      if (bVar4) {
        uVar6 = *cnPoints;
        if (1 < uVar6) {
          iVar10 = *prgnY;
          iVar11 = *prgnX;
          uVar12 = 1;
          do {
            iVar11 = iVar11 + prgnX[uVar12];
            prgnX[uVar12] = iVar11;
            iVar10 = iVar10 + prgnY[uVar12];
            prgnY[uVar12] = iVar10;
            uVar12 = uVar12 + 1;
          } while (uVar6 != uVar12);
        }
        bVar5 = 1;
        if (uVar6 != 0) {
          uVar12 = 0;
          do {
            prgfOnCurve[uVar12] = (bool)(prgfOnCurve[uVar12] & 1);
            uVar12 = uVar12 + 1;
          } while (uVar6 != uVar12);
        }
        goto LAB_001e38f8;
      }
    }
  }
  bVar5 = 0;
LAB_001e38f8:
  return (bool)(bVar5 & 1);
}

Assistant:

bool GlyfPoints(gr::gid16 nGlyphId, const void * pGlyf,
		const void * pLoca, size_t lLocaSize, const void * pHead,
		const int * prgnContourEndPoint, size_t cnEndPoints,
		int * prgnX, int * prgnY, bool * prgfOnCurve, size_t & cnPoints)
{
	std::fill_n(prgnX, cnPoints, INT_MAX);
	std::fill_n(prgnY, cnPoints, INT_MAX);

	if (IsSpace(nGlyphId, pLoca, lLocaSize, pHead)) 
		return false;

	void * pSimpleGlyf = GlyfLookup(nGlyphId, pGlyf, pLoca, lLocaSize, pHead);
	if (pSimpleGlyf == NULL)
		return false;

	int cContours = GlyfContourCount(pSimpleGlyf);
	size_t cActualPts;
	if (cContours > 0)
	{
		if (!GlyfPoints(pSimpleGlyf, prgnX, prgnY, (char *)prgfOnCurve, cnPoints, cActualPts))
			return false;
		CalcAbsolutePoints(prgnX, prgnY, cnPoints);
		SimplifyFlags((char *)prgfOnCurve, cnPoints);
		return true;
	}

	// handle composite glyphs	
	int rgnCompId[kMaxGlyphComponents]; // assumes no glyph will be made of more than 8 components
	size_t cCompIdTotal = kMaxGlyphComponents;
	size_t cCompId = 0;

	// this will fail if there are more components than there is room for
	if (!GetComponentGlyphIds(pSimpleGlyf, rgnCompId, cCompIdTotal, cCompId))
		return false;

	int * prgnCurrentX = prgnX;
	int * prgnCurrentY = prgnY;
	char * prgbCurrentFlag = (char *)prgfOnCurve; // converting bool to char should be safe
	auto cCurrentPoints = cnPoints;
	bool fOffset = true, fTransOff = true;
	int a, b;
	float flt11, flt12, flt21, flt22;
	// int * prgnPrevX = prgnX; // in case first att pt number relative to preceding glyph
	// int * prgnPrevY = prgnY;
	for (size_t i = 0; i < cCompId; i++)
	{
		if (IsSpace(static_cast<gr::gid16>(rgnCompId[i]), pLoca, lLocaSize, pHead)) {return false;}
		void * pCompGlyf = GlyfLookup(static_cast<gr::gid16>(rgnCompId[i]), pGlyf, 
										pLoca, lLocaSize, pHead);
		if (pCompGlyf == NULL) {return false;}
		if (!GlyfPoints(pCompGlyf, prgnCurrentX, prgnCurrentY, prgbCurrentFlag, 
						cCurrentPoints, cActualPts))
		{
			auto cNestedPts = cCurrentPoints;
			if (!GlyfPoints(static_cast<gr::gid16>(rgnCompId[i]), pGlyf, pLoca, lLocaSize, pHead, 
				prgnContourEndPoint, cnEndPoints, prgnCurrentX, prgnCurrentY, (bool *)prgbCurrentFlag, 
				cNestedPts))
				return false;
			cActualPts = cCurrentPoints - cNestedPts;
		} 
		else
		{
			// convert points to absolute coordinates
			// do before transform and attachment point placement are applied
			CalcAbsolutePoints(prgnCurrentX, prgnCurrentY, cActualPts);
		}

		if (!GetComponentPlacement(pSimpleGlyf, rgnCompId[i], fOffset, a, b))
			return false;
		if (!GetComponentTransform(pSimpleGlyf, rgnCompId[i], 
			flt11, flt12, flt21, flt22, fTransOff))
			return false;
		bool fIdTrans = flt11 == 1.0 && flt12 == 0.0 && flt21 == 0.0 && flt22 == 1.0;

		// apply transform - see main method note above
		// do before attachment point calcs
		if (!fIdTrans)
			for (auto j = 0U; j < cActualPts; j++)
			{
				int x = prgnCurrentX[j]; // store before transform applied
				int y = prgnCurrentY[j];
				prgnCurrentX[j] = (int)(x * flt11 + y * flt12);
				prgnCurrentY[j] = (int)(x * flt21 + y * flt22);
			}
			
		// apply placement - see main method note above
		int nXOff, nYOff;
		if (fOffset) // explicit x & y offsets
		{ 
			/* ignore fTransOff for now
			if (fTransOff && !fIdTrans) 
			{ 	// transform x & y offsets
				nXOff = (int)(a * flt11 + b * flt12);
				nYOff = (int)(a * flt21 + b * flt22);
			}
			else */ 
			{ // don't transform offset
				nXOff = a;
				nYOff = b;
			}
		}
		else  // attachment points
		{	// in case first point is relative to preceding glyph and second relative to current
			// nXOff = prgnPrevX[a] - prgnCurrentX[b];
			// nYOff = prgnPrevY[a] - prgnCurrentY[b];
			// first point number relative to whole composite, second relative to current glyph
			nXOff = prgnX[a] - prgnCurrentX[b];
			nYOff = prgnY[a] - prgnCurrentY[b];
		}
		for (auto j = 0U; j < cActualPts; j++)
		{
			prgnCurrentX[j] += nXOff;
			prgnCurrentY[j] += nYOff;
		}

		// prgnPrevX = prgnCurrentX;
		// prgnPrevY = prgnCurrentY;
		prgnCurrentX += cActualPts;
		prgnCurrentY += cActualPts;
		prgbCurrentFlag += cActualPts;
		cCurrentPoints -= cActualPts;
	}

	SimplifyFlags((char *)prgfOnCurve, cnPoints);
	cnPoints = cCurrentPoints;

	return true;
}